

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fastprojectile.cpp
# Opt level: O0

void __thiscall AFastProjectile::Effect(AFastProjectile *this)

{
  bool bVar1;
  uint uVar2;
  MetaClass *pMVar3;
  PClassActor *type;
  double dVar4;
  bool local_69;
  TFlags<ActorFlag5,_unsigned_int> local_54;
  DVector3 local_50;
  AActor *local_38;
  AActor *act;
  PClassActor *local_28;
  PClassActor *trail;
  double hitz;
  AFastProjectile *pAStack_10;
  FName name;
  AFastProjectile *this_local;
  
  pAStack_10 = this;
  pMVar3 = AActor::GetClass(&this->super_AActor);
  FName::FName((FName *)((long)&hitz + 4),&pMVar3->MissileName);
  bVar1 = FName::operator!=((FName *)((long)&hitz + 4),NAME_None);
  if (bVar1) {
    dVar4 = AActor::Z(&this->super_AActor);
    trail = (PClassActor *)(dVar4 - 8.0);
    if ((double)trail < (this->super_AActor).floorz) {
      trail = (PClassActor *)(this->super_AActor).floorz;
    }
    pMVar3 = AActor::GetClass(&this->super_AActor);
    trail = (PClassActor *)(pMVar3->MissileHeight + (double)trail);
    FName::FName((FName *)((long)&act + 4),(FName *)((long)&hitz + 4));
    type = PClass::FindActor((FName *)((long)&act + 4));
    if (type != (PClassActor *)0x0) {
      local_28 = type;
      AActor::PosAtZ(&local_50,&this->super_AActor,(double)trail);
      local_38 = Spawn(type,&local_50,ALLOW_REPLACE);
      if (local_38 != (AActor *)0x0) {
        TFlags<ActorFlag5,_unsigned_int>::operator&
                  (&local_54,
                   (int)this +
                   (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|MF5_NODROPOFF)
                  );
        uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
        local_69 = false;
        if (uVar2 != 0) {
          local_69 = TObjPtr<AActor>::operator!=(&(this->super_AActor).target,(AActor *)0x0);
        }
        if (local_69 == false) {
          TObjPtr<AActor>::operator=(&local_38->target,&this->super_AActor);
        }
        else {
          (local_38->target).field_0 = (this->super_AActor).target.field_0;
        }
        TAngle<double>::operator=(&(local_38->Angles).Pitch,&(this->super_AActor).Angles.Pitch);
        TAngle<double>::operator=(&(local_38->Angles).Yaw,&(this->super_AActor).Angles.Yaw);
      }
    }
  }
  return;
}

Assistant:

void AFastProjectile::Effect()
{
	FName name = GetClass()->MissileName;
	if (name != NAME_None)
	{
		double hitz = Z()-8;

		if (hitz < floorz)
		{
			hitz = floorz;
		}
		// Do not clip this offset to the floor.
		hitz += GetClass()->MissileHeight;
		
		PClassActor *trail = PClass::FindActor(name);
		if (trail != NULL)
		{
			AActor *act = Spawn (trail, PosAtZ(hitz), ALLOW_REPLACE);
			if (act != nullptr)
			{
				if ((flags5 & MF5_GETOWNER) && (target != nullptr))
					act->target = target;
				else
					act->target = this;
				
				act->Angles.Pitch = Angles.Pitch;
				act->Angles.Yaw = Angles.Yaw;
			}
		}
	}
}